

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_private.h
# Opt level: O1

char * ERR_getErrorName(size_t code)

{
  uint uVar1;
  
  uVar1 = 0;
  if (0xfffffffffffffff7 < code) {
    uVar1 = -(int)code;
  }
  if (uVar1 < 9) {
    return &DAT_0018b058 + *(int *)(&DAT_0018b058 + (ulong)uVar1 * 4);
  }
  return "Unspecified error code";
}

Assistant:

ERR_STATIC ERR_enum ERR_getErrorCode(size_t code) { if (!ERR_isError(code)) return (ERR_enum)0; return (ERR_enum) (0-code); }